

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csoaa.cc
# Opt level: O2

void CSOAA::do_actual_learning_oaa(ldf *data,single_learner *base,size_t start_K,multi_ex *ec_seq)

{
  pointer ppeVar1;
  example *ec;
  wclass *pwVar2;
  uint64_t uVar3;
  wclass *pwVar4;
  wclass *pwVar5;
  size_t sVar6;
  ulong uVar7;
  size_t k_1;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  
  ppeVar1 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  uVar7 = (long)(ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)ppeVar1 >> 3;
  fVar11 = -3.4028235e+38;
  fVar12 = 3.4028235e+38;
  for (sVar6 = start_K; sVar6 < uVar7; sVar6 = sVar6 + 1) {
    fVar8 = ((ppeVar1[sVar6]->l).cs.costs._begin)->x;
    fVar10 = fVar8;
    if (fVar12 <= fVar8) {
      fVar10 = fVar12;
    }
    if (fVar8 <= fVar11) {
      fVar8 = fVar11;
    }
    fVar11 = fVar8;
    fVar12 = fVar10;
  }
  for (; start_K < uVar7; start_K = start_K + 1) {
    ec = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
         super__Vector_impl_data._M_start[start_K];
    pwVar2 = (ec->l).cs.costs._begin;
    sVar6 = (ec->l).cs.costs.erase_count;
    pwVar4 = (ec->l).cs.costs._end;
    pwVar5 = (ec->l).cs.costs.end_array;
    fVar8 = ec->weight;
    fVar10 = pwVar2->x;
    if (data->treat_as_classifier == true) {
      fVar9 = fVar10;
      if (fVar12 >= fVar10) {
        fVar9 = fVar11;
      }
      ec->weight = (fVar9 - fVar12) * fVar8;
      fVar10 = *(float *)(&DAT_002345c8 + (ulong)(fVar12 < fVar10) * 4);
    }
    (ec->l).simple.label = fVar10;
    (ec->l).simple.initial = 0.0;
    LabelDict::add_example_namespace_from_memory
              (&data->label_features,ec,(ulong)pwVar2->class_index);
    uVar3 = (ec->super_example_predict).ft_offset;
    (ec->super_example_predict).ft_offset = data->ft_offset;
    LEARNER::learner<char,_example>::learn(base,ec,0);
    (ec->super_example_predict).ft_offset = uVar3;
    LabelDict::del_example_namespace_from_memory
              (&data->label_features,ec,(ulong)pwVar2->class_index);
    ec->weight = fVar8;
    (ec->l).cs.costs._begin = pwVar2;
    (ec->l).cs.costs.erase_count = sVar6;
    (ec->l).cs.costs._end = pwVar4;
    (ec->l).cs.costs.end_array = pwVar5;
    ec->partial_prediction = pwVar2->partial_prediction;
  }
  return;
}

Assistant:

void do_actual_learning_oaa(ldf& data, single_learner& base, size_t start_K, multi_ex& ec_seq)
{
  size_t K = ec_seq.size();
  float min_cost = FLT_MAX;
  float max_cost = -FLT_MAX;

  for (size_t k = start_K; k < K; k++)
  {
    float ec_cost = ec_seq[k]->l.cs.costs[0].x;
    if (ec_cost < min_cost)
      min_cost = ec_cost;
    if (ec_cost > max_cost)
      max_cost = ec_cost;
  }

  for (size_t k = start_K; k < K; k++)
  {
    example* ec = ec_seq[k];

    // save original variables
    label save_cs_label = ec->l.cs;
    v_array<COST_SENSITIVE::wclass> costs = save_cs_label.costs;

    // build example for the base learner
    label_data simple_label;

    simple_label.initial = 0.;
    float old_weight = ec->weight;
    if (!data.treat_as_classifier)  // treat like regression
      simple_label.label = costs[0].x;
    else  // treat like classification
    {
      if (costs[0].x <= min_cost)
      {
        simple_label.label = -1.;
        ec->weight = old_weight * (max_cost - min_cost);
      }
      else
      {
        simple_label.label = 1.;
        ec->weight = old_weight * (costs[0].x - min_cost);
      }
    }
    ec->l.simple = simple_label;

    // learn
    LabelDict::add_example_namespace_from_memory(data.label_features, *ec, costs[0].class_index);
    uint64_t old_offset = ec->ft_offset;
    ec->ft_offset = data.ft_offset;
    base.learn(*ec);
    ec->ft_offset = old_offset;
    LabelDict::del_example_namespace_from_memory(data.label_features, *ec, costs[0].class_index);
    ec->weight = old_weight;

    // restore original cost-sensitive label, sum of importance weights and partial_prediction
    ec->l.cs = save_cs_label;
    ec->partial_prediction = costs[0].partial_prediction;
  }
}